

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O3

ssize_t correct_reed_solomon_decode_with_erasures
                  (correct_reed_solomon *rs,uint8_t *encoded,size_t encoded_length,
                  uint8_t *erasure_locations,size_t erasure_length,uint8_t *msg)

{
  polynomial_t *ppVar1;
  byte *pbVar2;
  byte bVar3;
  uint uVar4;
  field_logarithm_t *pfVar5;
  field_element_t *pfVar6;
  field_element_t *pfVar7;
  field_logarithm_t *pfVar8;
  field_logarithm_t **ppfVar9;
  size_t sVar10;
  bool bVar11;
  undefined8 uVar12;
  undefined4 uVar13;
  undefined8 uVar14;
  undefined4 uVar15;
  undefined8 uVar16;
  undefined4 uVar17;
  undefined8 uVar18;
  undefined4 uVar19;
  polynomial_t res;
  polynomial_t res_00;
  field_t fVar20;
  undefined8 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  field_element_t fVar24;
  uint i_1;
  uint uVar25;
  ulong uVar26;
  ssize_t sVar27;
  void *__dest;
  ulong uVar28;
  ulong uVar29;
  uint uVar30;
  size_t sVar31;
  ulong uVar32;
  field_operation_t i_2;
  long lVar33;
  polynomial_t polynomial;
  polynomial_t r;
  polynomial_t r_00;
  polynomial_t pVar34;
  polynomial_t poly;
  polynomial_t l;
  polynomial_t poly_log;
  polynomial_t l_00;
  polynomial_t temp_poly;
  polynomial_t placeholder_poly;
  undefined4 uStack_94;
  
  if (erasure_length == 0) {
    sVar27 = correct_reed_solomon_decode(rs,encoded,encoded_length,msg);
    return sVar27;
  }
  uVar28 = rs->block_length;
  uVar26 = 0xffffffffffffffff;
  if ((encoded_length <= uVar28) && (uVar29 = rs->min_distance, erasure_length <= uVar29)) {
    if (rs->has_init_decode == false) {
      correct_reed_solomon_decoder_create(rs);
    }
    if (encoded_length != 0) {
      uVar25 = 1;
      uVar26 = 0;
      do {
        uVar32 = (ulong)uVar25;
        uVar25 = uVar25 + 1;
        (rs->received_polynomial).coeff[uVar26] = encoded[encoded_length - uVar32];
        uVar26 = uVar32;
      } while (uVar32 <= encoded_length && encoded_length - uVar32 != 0);
    }
    if (uVar28 != encoded_length) {
      uVar25 = 1;
      uVar26 = 0;
      do {
        (rs->received_polynomial).coeff[encoded_length + uVar26] = '\0';
        uVar26 = (ulong)uVar25;
        uVar25 = uVar25 + 1;
      } while (uVar26 < uVar28 - encoded_length);
    }
    uVar26 = encoded_length - uVar29;
    uVar25 = 1;
    uVar29 = 0;
    do {
      rs->error_locations[uVar29] =
           ~(erasure_locations[uVar29] + (char)(uVar28 - encoded_length)) +
           (char)(int)rs->block_length;
      uVar29 = (ulong)uVar25;
      uVar25 = uVar25 + 1;
    } while (uVar29 < erasure_length);
    bVar3 = rs->generator_root_gap;
    pfVar5 = rs->error_locations;
    pfVar6 = rs->error_roots;
    pfVar7 = (rs->field).exp;
    pfVar8 = (rs->field).log;
    sVar31 = 0;
    do {
      if ((ulong)pfVar7[((uint)pfVar8[pfVar7[pfVar5[sVar31]]] * (uint)bVar3) % 0xff] == 0) {
        fVar24 = '\0';
      }
      else {
        fVar24 = pfVar7[((ulong)pfVar8[1] -
                        (ulong)pfVar8[pfVar7[((uint)pfVar8[pfVar7[pfVar5[sVar31]]] * (uint)bVar3) %
                                             0xff]]) + 0xff];
      }
      pfVar6[sVar31] = fVar24;
      sVar31 = sVar31 + 1;
    } while (erasure_length != sVar31);
    uVar12 = (rs->erasure_locator).coeff;
    uVar13 = (rs->erasure_locator).order;
    pVar34.order = uVar13;
    pVar34.coeff = (field_element_t *)uVar12;
    pVar34._12_4_ = 0;
    uVar25 = (uint)erasure_length;
    pVar34 = polynomial_init_from_roots
                       (rs->field,uVar25,rs->error_roots,pVar34,rs->init_from_roots_scratch);
    (rs->erasure_locator).coeff = pVar34.coeff;
    (rs->erasure_locator).order = pVar34.order;
    ppfVar9 = rs->generator_root_exp;
    pfVar6 = rs->syndromes;
    sVar10 = rs->min_distance;
    fVar20 = rs->field;
    uVar21 = (rs->received_polynomial).coeff;
    uVar22 = (rs->received_polynomial).order;
    poly.order = uVar22;
    poly.coeff = (field_element_t *)uVar21;
    memset(pfVar6,0,sVar10);
    if (sVar10 != 0) {
      bVar11 = true;
      uVar30 = 1;
      uVar28 = 0;
      do {
        poly._12_4_ = 0;
        fVar24 = polynomial_eval_lut(fVar20,poly,ppfVar9[uVar28]);
        bVar11 = (bool)(bVar11 & fVar24 == '\0');
        pfVar6[uVar28] = fVar24;
        uVar28 = (ulong)uVar30;
        uVar30 = uVar30 + 1;
      } while (uVar28 < sVar10);
      if (!bVar11) {
        uVar14 = (rs->erasure_locator).coeff;
        uVar15 = (rs->erasure_locator).order;
        l.order = uVar15;
        l.coeff = (field_element_t *)uVar14;
        r.order = (int)rs->min_distance + -1;
        res._12_4_ = uStack_94;
        res.order = r.order;
        res.coeff = rs->modified_syndromes;
        r.coeff = rs->syndromes;
        r._12_4_ = 0;
        l._12_4_ = 0;
        polynomial_mul(rs->field,l,r,res);
        sVar10 = rs->min_distance;
        __dest = malloc(sVar10);
        memcpy(__dest,rs->syndromes,sVar10);
        uVar28 = erasure_length;
        uVar30 = uVar25;
        if (erasure_length < sVar10) {
          do {
            uVar30 = uVar30 + 1;
            rs->syndromes[uVar28 - erasure_length] = rs->modified_syndromes[uVar28];
            uVar28 = (ulong)uVar30;
          } while ((ulong)uVar30 < rs->min_distance);
        }
        uVar30 = reed_solomon_find_error_locator(rs,erasure_length);
        ppVar1 = &rs->error_locator;
        (rs->error_locator).order = uVar30;
        uVar30 = 0;
        do {
          (rs->error_locator_log).coeff[uVar30] = (rs->field).log[(rs->error_locator).coeff[uVar30]]
          ;
          uVar30 = uVar30 + 1;
          uVar4 = (rs->error_locator).order;
        } while (uVar30 <= uVar4);
        (rs->error_locator_log).order = uVar4;
        pfVar6 = rs->error_roots;
        ppfVar9 = rs->element_exp;
        fVar20 = rs->field;
        pfVar7 = (rs->error_locator_log).coeff;
        lVar33 = 0;
        memset(pfVar6 + erasure_length,0,(ulong)uVar4);
        do {
          poly_log.order = uVar4;
          poly_log.coeff = pfVar7;
          poly_log._12_4_ = 0;
          fVar24 = polynomial_eval_log_lut(fVar20,poly_log,ppfVar9[lVar33]);
          if (fVar24 == '\0') {
            pfVar6[erasure_length & 0xffffffff] = (field_element_t)lVar33;
            erasure_length = (size_t)((int)erasure_length + 1);
          }
          lVar33 = lVar33 + 1;
        } while (lVar33 != 0x100);
        if ((int)erasure_length == uVar4 + uVar25) {
          pVar34 = polynomial_create((rs->error_locator).order + uVar25);
          uVar18 = (rs->erasure_locator).coeff;
          uVar19 = (rs->erasure_locator).order;
          l_00.order = uVar19;
          l_00.coeff = (field_element_t *)uVar18;
          uVar16 = (rs->error_locator).coeff;
          uVar17 = (rs->error_locator).order;
          r_00.order = uVar17;
          r_00.coeff = (field_element_t *)uVar16;
          res_00._12_4_ = uStack_94;
          res_00.order = pVar34.order;
          uVar30 = (uint)pVar34.coeff;
          res_00.coeff = pVar34.coeff;
          r_00._12_4_ = 0;
          l_00._12_4_ = 0;
          polynomial_mul(rs->field,l_00,r_00,res_00);
          pfVar6 = ppVar1->coeff;
          uVar25 = (rs->error_locator).order;
          uVar23 = *(undefined4 *)&(rs->error_locator).field_0xc;
          ppVar1->coeff = pVar34.coeff;
          *(ulong *)&(rs->error_locator).order = CONCAT44(uStack_94,pVar34.order);
          reed_solomon_find_error_locations
                    (rs->field,rs->generator_root_gap,rs->error_roots,rs->error_locations,
                     (rs->error_locator).order,uVar30);
          memcpy(rs->syndromes,__dest,rs->min_distance);
          reed_solomon_find_error_values(rs);
          if ((rs->error_locator).order != 0) {
            uVar28 = 0;
            do {
              pbVar2 = (rs->received_polynomial).coeff + rs->error_locations[uVar28];
              *pbVar2 = *pbVar2 ^ rs->error_vals[uVar28];
              uVar28 = uVar28 + 1;
            } while (uVar28 < (rs->error_locator).order);
          }
          ppVar1->coeff = pfVar6;
          (rs->error_locator).order = uVar25;
          *(undefined4 *)&(rs->error_locator).field_0xc = uVar23;
          if (uVar26 != 0) {
            uVar25 = 1;
            uVar28 = 0;
            do {
              uVar29 = (ulong)uVar25;
              msg[uVar28] = (rs->received_polynomial).coeff[encoded_length - uVar29];
              uVar25 = uVar25 + 1;
              uVar28 = uVar29;
            } while (uVar29 < uVar26);
          }
          polynomial._12_4_ = 0;
          polynomial.coeff = (field_element_t *)SUB128(pVar34._0_12_,0);
          polynomial.order = SUB124(pVar34._0_12_,8);
          polynomial_destroy(polynomial);
          free(__dest);
          return uVar26;
        }
        free(__dest);
        return -1;
      }
    }
    if (uVar26 == 0) {
      uVar26 = 0;
    }
    else {
      uVar28 = 0;
      uVar29 = 1;
      do {
        msg[uVar28] = (rs->received_polynomial).coeff[encoded_length - uVar29];
        bVar11 = uVar29 < uVar26;
        uVar28 = uVar29;
        uVar29 = (ulong)((int)uVar29 + 1);
      } while (bVar11);
    }
  }
  return uVar26;
}

Assistant:

ssize_t correct_reed_solomon_decode_with_erasures(correct_reed_solomon *rs, const uint8_t *encoded,
                                                  size_t encoded_length, const uint8_t *erasure_locations,
                                                  size_t erasure_length, uint8_t *msg) {
    if (!erasure_length) {
        return correct_reed_solomon_decode(rs, encoded, encoded_length, msg);
    }

    if (encoded_length > rs->block_length) {
        return -1;
    }

    if (erasure_length > rs->min_distance) {
        return -1;
    }

    // the message is the non-remainder part
    size_t msg_length = encoded_length - rs->min_distance;
    // if they handed us a nonfull block, we'll write in 0s
    size_t pad_length = rs->block_length - encoded_length;

    if (!rs->has_init_decode) {
        // initialize rs for decoding
        correct_reed_solomon_decoder_create(rs);
    }

    // we need to copy to our local buffer
    // the buffer we're given has the coordinates in the wrong direction
    // e.g. byte 0 corresponds to the 254th order coefficient
    // so we're going to flip and then write padding
    // the final copied buffer will look like
    // | rem (rs->min_distance) | msg (msg_length) | pad (pad_length) |

    for (unsigned int i = 0; i < encoded_length; i++) {
        rs->received_polynomial.coeff[i] = encoded[encoded_length - (i + 1)];
    }

    // fill the pad_length with 0s
    for (unsigned int i = 0; i < pad_length; i++) {
        rs->received_polynomial.coeff[i + encoded_length] = 0;
    }

    for (unsigned int i = 0; i < erasure_length; i++) {
        // remap the coordinates of the erasures
        rs->error_locations[i] = rs->block_length - (erasure_locations[i] + pad_length + 1);
    }

    reed_solomon_find_error_roots_from_locations(rs->field, rs->generator_root_gap, rs->error_locations,
                                                 rs->error_roots, erasure_length);

    rs->erasure_locator =
        reed_solomon_find_error_locator_from_roots(rs->field, erasure_length, rs->error_roots, rs->erasure_locator, rs->init_from_roots_scratch);

    bool all_zero = reed_solomon_find_syndromes(rs->field, rs->received_polynomial, rs->generator_root_exp,
                                                rs->syndromes, rs->min_distance);

    if (all_zero) {
        // syndromes were all zero, so there was no error in the message
        // copy to msg and we are done
        for (unsigned int i = 0; i < msg_length; i++) {
            msg[i] = rs->received_polynomial.coeff[encoded_length - (i + 1)];
        }
        return msg_length;
    }

    reed_solomon_find_modified_syndromes(rs, rs->syndromes, rs->erasure_locator, rs->modified_syndromes);

    field_element_t *syndrome_copy = malloc(rs->min_distance * sizeof(field_element_t));
    memcpy(syndrome_copy, rs->syndromes, rs->min_distance * sizeof(field_element_t));

    for (unsigned int i = erasure_length; i < rs->min_distance; i++) {
        rs->syndromes[i - erasure_length] = rs->modified_syndromes[i];
    }

    unsigned int order = reed_solomon_find_error_locator(rs, erasure_length);
    // XXX fix this vvvv
    rs->error_locator.order = order;

    for (unsigned int i = 0; i <= rs->error_locator.order; i++) {
        // this is a little strange since the coeffs are logs, not elements
        // also, we'll be storing log(0) = 0 for any 0 coeffs in the error locator
        // that would seem bad but we'll just be using this in chien search, and we'll skip all 0 coeffs
        // (you might point out that log(1) also = 0, which would seem to alias. however, that's ok,
        //   because log(1) = 255 as well, and in fact that's how it's represented in our log table)
        rs->error_locator_log.coeff[i] = rs->field.log[rs->error_locator.coeff[i]];
    }
    rs->error_locator_log.order = rs->error_locator.order;

    /*
    for (unsigned int i = 0; i < erasure_length; i++) {
        rs->error_roots[i] = field_div(rs->field, 1, rs->error_roots[i]);
    }
    */

    if (!reed_solomon_factorize_error_locator(rs->field, erasure_length, rs->error_locator_log, rs->error_roots, rs->element_exp)) {
        // roots couldn't be found, so there were too many errors to deal with
        // RS has failed for this message
        free(syndrome_copy);
        return -1;
    }

    polynomial_t temp_poly = polynomial_create(rs->error_locator.order + erasure_length);
    polynomial_mul(rs->field, rs->erasure_locator, rs->error_locator, temp_poly);
    polynomial_t placeholder_poly = rs->error_locator;
    rs->error_locator = temp_poly;

    reed_solomon_find_error_locations(rs->field, rs->generator_root_gap, rs->error_roots, rs->error_locations,
                                      rs->error_locator.order, erasure_length);

    memcpy(rs->syndromes, syndrome_copy, rs->min_distance * sizeof(field_element_t));

    reed_solomon_find_error_values(rs);

    for (unsigned int i = 0; i < rs->error_locator.order; i++) {
        rs->received_polynomial.coeff[rs->error_locations[i]] =
            field_sub(rs->field, rs->received_polynomial.coeff[rs->error_locations[i]], rs->error_vals[i]);
    }

    rs->error_locator = placeholder_poly;

    for (unsigned int i = 0; i < msg_length; i++) {
        msg[i] = rs->received_polynomial.coeff[encoded_length - (i + 1)];
    }

    polynomial_destroy(temp_poly);
    free(syndrome_copy);

    return msg_length;
}